

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O0

void png_do_write_intrapixel(png_row_infop row_info,png_bytep row)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  png_uint_32 blue;
  png_uint_32 red;
  png_uint_32 s2;
  png_uint_32 s1;
  png_uint_32 s0;
  png_uint_32 i_1;
  png_bytep rp_1;
  png_bytep ppStack_28;
  png_uint_32 i;
  png_bytep rp;
  png_uint_32 row_width;
  int bytes_per_pixel;
  png_bytep row_local;
  png_row_infop row_info_local;
  
  if ((row_info->color_type & 2) != 0) {
    uVar1 = row_info->width;
    if (row_info->bit_depth == '\b') {
      if (row_info->color_type == '\x02') {
        rp._4_4_ = 3;
      }
      else {
        if (row_info->color_type != '\x06') {
          return;
        }
        rp._4_4_ = 4;
      }
      ppStack_28 = row;
      for (rp_1._4_4_ = 0; rp_1._4_4_ < uVar1; rp_1._4_4_ = rp_1._4_4_ + 1) {
        *ppStack_28 = *ppStack_28 - ppStack_28[1];
        ppStack_28[2] = ppStack_28[2] - ppStack_28[1];
        ppStack_28 = ppStack_28 + rp._4_4_;
      }
    }
    else if (row_info->bit_depth == '\x10') {
      if (row_info->color_type == '\x02') {
        rp._4_4_ = 6;
      }
      else {
        if (row_info->color_type != '\x06') {
          return;
        }
        rp._4_4_ = 8;
      }
      _s0 = row;
      for (s1 = 0; s1 < uVar1; s1 = s1 + 1) {
        uVar2 = (uint)CONCAT11(*_s0,_s0[1]) - (uint)CONCAT11(_s0[2],_s0[3]) & 0xffff;
        uVar3 = (uint)CONCAT11(_s0[4],_s0[5]) - (uint)CONCAT11(_s0[2],_s0[3]) & 0xffff;
        *_s0 = (png_byte)(uVar2 >> 8);
        _s0[1] = (png_byte)uVar2;
        _s0[4] = (png_byte)(uVar3 >> 8);
        _s0[5] = (png_byte)uVar3;
        _s0 = _s0 + rp._4_4_;
      }
    }
  }
  return;
}

Assistant:

static void
png_do_write_intrapixel(png_row_infop row_info, png_bytep row)
{
   png_debug(1, "in png_do_write_intrapixel");

   if ((row_info->color_type & PNG_COLOR_MASK_COLOR) != 0)
   {
      int bytes_per_pixel;
      png_uint_32 row_width = row_info->width;
      if (row_info->bit_depth == 8)
      {
         png_bytep rp;
         png_uint_32 i;

         if (row_info->color_type == PNG_COLOR_TYPE_RGB)
            bytes_per_pixel = 3;

         else if (row_info->color_type == PNG_COLOR_TYPE_RGB_ALPHA)
            bytes_per_pixel = 4;

         else
            return;

         for (i = 0, rp = row; i < row_width; i++, rp += bytes_per_pixel)
         {
            *(rp)     = (png_byte)(*rp       - *(rp + 1));
            *(rp + 2) = (png_byte)(*(rp + 2) - *(rp + 1));
         }
      }

#ifdef PNG_WRITE_16BIT_SUPPORTED
      else if (row_info->bit_depth == 16)
      {
         png_bytep rp;
         png_uint_32 i;

         if (row_info->color_type == PNG_COLOR_TYPE_RGB)
            bytes_per_pixel = 6;

         else if (row_info->color_type == PNG_COLOR_TYPE_RGB_ALPHA)
            bytes_per_pixel = 8;

         else
            return;

         for (i = 0, rp = row; i < row_width; i++, rp += bytes_per_pixel)
         {
            png_uint_32 s0   = (png_uint_32)(*(rp    ) << 8) | *(rp + 1);
            png_uint_32 s1   = (png_uint_32)(*(rp + 2) << 8) | *(rp + 3);
            png_uint_32 s2   = (png_uint_32)(*(rp + 4) << 8) | *(rp + 5);
            png_uint_32 red  = (png_uint_32)((s0 - s1) & 0xffffL);
            png_uint_32 blue = (png_uint_32)((s2 - s1) & 0xffffL);
            *(rp    ) = (png_byte)(red >> 8);
            *(rp + 1) = (png_byte)red;
            *(rp + 4) = (png_byte)(blue >> 8);
            *(rp + 5) = (png_byte)blue;
         }
      }
#endif /* WRITE_16BIT */
   }
}